

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  list_iterator tmp_1;
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  list_iterator tmp;
  char *pcVar4;
  list<int> l;
  list<int> y;
  list<int> local_40;
  list<int> local_30;
  int local_1c;
  
  pnVar1 = (node *)operator_new(0x18);
  pnVar1->data = 0;
  pnVar1->prev = pnVar1;
  pnVar1->next = pnVar1;
  local_40.mSize = 0;
  local_40.mHeader = pnVar1;
  pnVar2 = (node *)operator_new(0x18);
  pnVar2->data = 9;
  pnVar2->prev = pnVar1;
  pnVar2->next = pnVar1;
  pnVar1->next = pnVar2;
  pnVar1->prev = pnVar2;
  local_40.mSize = 1;
  pnVar3 = (node *)operator_new(0x18);
  pnVar3->data = 2;
  pnVar3->prev = pnVar2;
  pnVar3->next = pnVar1;
  pnVar2->next = pnVar3;
  pnVar1->prev = pnVar3;
  local_40.mSize = 2;
  pnVar2 = (node *)operator_new(0x18);
  pnVar2->data = 2;
  pnVar2->prev = pnVar3;
  pnVar2->next = pnVar1;
  pnVar3->next = pnVar2;
  pnVar1->prev = pnVar2;
  local_40.mSize = 3;
  pnVar3 = (node *)operator_new(0x18);
  pnVar3->data = 4;
  pnVar3->prev = pnVar2;
  pnVar3->next = pnVar1;
  pnVar2->next = pnVar3;
  pnVar1->prev = pnVar3;
  local_40.mSize = 4;
  pnVar2 = (node *)operator_new(0x18);
  pnVar2->data = 2;
  pnVar2->prev = pnVar3;
  pnVar2->next = pnVar1;
  pnVar3->next = pnVar2;
  pnVar1->prev = pnVar2;
  local_40.mSize = 5;
  pnVar3 = (node *)operator_new(0x18);
  pnVar3->data = 7;
  pnVar3->prev = pnVar2;
  pnVar3->next = pnVar1;
  pnVar2->next = pnVar3;
  pnVar1->prev = pnVar3;
  local_40.mSize = 6;
  pnVar1 = (node *)operator_new(0x18);
  pnVar1->data = 0;
  pnVar1->prev = pnVar1;
  pnVar1->next = pnVar1;
  local_30.mSize = 0;
  local_30.mHeader = pnVar1;
  pnVar2 = (node *)operator_new(0x18);
  pnVar2->data = 3;
  pnVar2->prev = pnVar1;
  pnVar2->next = pnVar1;
  pnVar1->next = pnVar2;
  pnVar1->prev = pnVar2;
  local_30.mSize = 1;
  pnVar3 = (node *)operator_new(0x18);
  pnVar3->data = 2;
  pnVar3->prev = pnVar2;
  pnVar3->next = pnVar1;
  pnVar2->next = pnVar3;
  pnVar1->prev = pnVar3;
  local_30.mSize = 2;
  pnVar2 = (node *)operator_new(0x18);
  pnVar2->data = 1;
  pnVar2->prev = pnVar3;
  pnVar2->next = pnVar1;
  pnVar3->next = pnVar2;
  pnVar1->prev = pnVar2;
  local_30.mSize = 3;
  local_1c = 2;
  CP::list<int>::replace(&local_40,&local_1c,&local_30);
  pnVar1 = (local_40.mHeader)->next;
  CP::list<int>::print(&local_40);
  pcVar4 = "Wrong";
  if (((((pnVar1->data == 9) && (pnVar1 = pnVar1->next, pnVar1->data == 3)) &&
       (pnVar1 = pnVar1->next, pnVar1->data == 2)) &&
      ((((pnVar1 = pnVar1->next, pnVar1->data == 1 && (pnVar1 = pnVar1->next, pnVar1->data == 3)) &&
        ((pnVar1 = pnVar1->next, pnVar1->data == 2 &&
         ((pnVar1 = pnVar1->next, pnVar1->data == 1 && (pnVar1 = pnVar1->next, pnVar1->data == 4))))
        )) && (pnVar1 = pnVar1->next, pnVar1->data == 3)))) &&
     (((pnVar1 = pnVar1->next, pnVar1->data == 2 && (pnVar1 = pnVar1->next, pnVar1->data == 1)) &&
      (pcVar4 = "Wrong", pnVar1->next->data == 7)))) {
    pcVar4 = "Right";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  CP::list<int>::~list(&local_30);
  CP::list<int>::~list(&local_40);
  return 0;
}

Assistant:

int main() {
	CP::list<int> l;
	l.push_back(9);
	l.push_back(2);
	l.push_back(2);
	l.push_back(4);
	l.push_back(2);
	l.push_back(7);
	CP::list<int> y;
	y.push_back(3);
	y.push_back(2);
	y.push_back(1);

	l.replace(2, y);
	CP::list<int>::iterator it = l.begin();
	l.print();
	if ((*it++ == 9) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 4) &&
		(*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 7)) {
		std::cout << "Right" << std::endl;
	}
	else {
		std::cout << "Wrong" << std::endl;
	}

	return 0;
}